

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_ModelComponent::ChangeName
          (ON_ModelComponent *this,wchar_t *new_name,ON_ComponentManifest *manifest)

{
  ON_UUID manifest_item_id;
  Type component_type_00;
  bool bVar1;
  ON_UUID *pOVar2;
  ON_ComponentManifestItem *pOVar3;
  wchar_t *name;
  bool local_144;
  ON_UUID *local_100;
  bool rc;
  undefined1 local_90 [8];
  ON_NameHash new_name_hash;
  ON_UUID name_parent_id;
  ON_wString local_48;
  ON_wString local_name;
  bool bUniqueNameRequired;
  Type component_type;
  ON_ComponentManifest *manifest_local;
  wchar_t *new_name_local;
  ON_ModelComponent *this_local;
  
  component_type_00 = ComponentType(this);
  if (manifest != (ON_ComponentManifest *)0x0) {
    pOVar2 = Id(this);
    local_name.m_s._4_4_ = pOVar2->Data1;
    unique0x00012004 = pOVar2->Data2;
    unique0x00012006 = pOVar2->Data3;
    pOVar3 = ON_ComponentManifest::ItemFromId(manifest,component_type_00,*pOVar2);
    bVar1 = ON_ComponentManifestItem::IsUnset(pOVar3);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x540,"","component is not in the manifest.");
      return false;
    }
  }
  local_name.m_s._3_1_ = UniqueNameRequired(component_type_00);
  ON_wString::ON_wString(&local_48,new_name);
  ON_wString::TrimLeftAndRight(&local_48,(wchar_t *)0x0);
  name = ON_wString::operator_cast_to_wchar_t_(&local_48);
  bVar1 = UniqueNameIncludesParent(component_type_00);
  if (bVar1) {
    local_100 = ParentId(this);
  }
  else {
    local_100 = &ON_nil_uuid;
  }
  new_name_hash.m_parent_id.Data4 = *(uchar (*) [8])local_100;
  ON_NameHash::Create((ON_NameHash *)local_90,(ON_UUID *)new_name_hash.m_parent_id.Data4,name);
  bVar1 = ON_wString::IsEmpty(&local_48);
  if (bVar1) {
    if ((local_name.m_s._3_1_ & 1) != 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x552,"","This component cannot have an empty name.");
      this_local._7_1_ = false;
      goto LAB_0076904e;
    }
  }
  else {
    bVar1 = IsValidComponentName(name);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x558,"","Invalid component name.");
      this_local._7_1_ = false;
      goto LAB_0076904e;
    }
    if (((local_name.m_s._3_1_ & 1) != 0) && (manifest != (ON_ComponentManifest *)0x0)) {
      pOVar3 = ON_ComponentManifest::ItemFromNameHash
                         (manifest,component_type_00,(ON_NameHash *)local_90);
      bVar1 = ON_ComponentManifestItem::IsValid(pOVar3);
      if (bVar1) {
        this_local._7_1_ = false;
        goto LAB_0076904e;
      }
    }
  }
  if (manifest != (ON_ComponentManifest *)0x0) {
    pOVar2 = Id(this);
    manifest_item_id = *pOVar2;
    pOVar2 = ParentId(this);
    pOVar3 = ON_ComponentManifest::ChangeComponentName
                       (manifest,manifest_item_id,component_type_00,*pOVar2,name);
    bVar1 = ON_ComponentManifestItem::IsUnset(pOVar3);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x569,"","Unable to update manifest.");
      this_local._7_1_ = false;
      goto LAB_0076904e;
    }
  }
  bVar1 = ON_wString::IsEmpty(&local_48);
  if (bVar1) {
    local_144 = ClearName(this);
  }
  else {
    local_144 = SetName(this,name);
  }
  if (local_144 == false) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x574,"","Unable to change component name.");
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
LAB_0076904e:
  ON_wString::~ON_wString(&local_48);
  return this_local._7_1_;
}

Assistant:

bool ON_ModelComponent::ChangeName(
  const wchar_t* new_name,
  class ON_ComponentManifest* manifest
)
{
  const ON_ModelComponent::Type component_type = ComponentType();

  if (nullptr != manifest)
  {
    if (manifest->ItemFromId(component_type, Id()).IsUnset())
    {
      ON_ERROR("component is not in the manifest.");
      return false;
    }
  }

  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(component_type);
  ON_wString local_name(new_name);
  local_name.TrimLeftAndRight();
  new_name = local_name;
  const ON_UUID name_parent_id
    = ON_ModelComponent::UniqueNameIncludesParent(component_type)
    ? ParentId()
    : ON_nil_uuid;
  const ON_NameHash new_name_hash = ON_NameHash::Create(name_parent_id,new_name);
  if (local_name.IsEmpty() )
  {
    if (bUniqueNameRequired)
    {
      ON_ERROR("This component cannot have an empty name.");
      return false;
    }
  }
  else if (ON_ModelComponent::IsValidComponentName(new_name))
  {
    ON_ERROR("Invalid component name.");
    return false;
  }
  else if (bUniqueNameRequired && nullptr != manifest )
  {
    if (manifest->ItemFromNameHash(component_type, new_name_hash).IsValid())
    {
      // name is already being used.
      return false;
    }
  }

  if ( 
    nullptr != manifest
    && manifest->ChangeComponentName(Id(), component_type, ParentId(), new_name).IsUnset() 
    )
  {
    ON_ERROR("Unable to update manifest.");
    return false;
  }

  const bool rc
    = (local_name.IsEmpty())
    ? ClearName()
    : SetName(new_name);

  if (false == rc)
  {
    ON_ERROR("Unable to change component name.");
    return false;
  }

  return true;
}